

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QPoint __thiscall QWidget::pos(QWidget *this)

{
  long lVar1;
  bool bVar2;
  WindowType WVar3;
  QPoint QVar4;
  QTLWExtra *pQVar5;
  QWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetPrivate *d;
  QPoint result;
  QRect *in_stack_ffffffffffffffb8;
  QWidgetPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QWidget *)0x35af6a);
  QVar4 = QRect::topLeft(in_stack_ffffffffffffffb8);
  bVar2 = isWindow((QWidget *)in_RDI);
  if (((bVar2) && (WVar3 = windowType((QWidget *)in_RDI), WVar3 != Popup)) &&
     ((pQVar5 = QWidgetPrivate::maybeTopData(in_RDI), pQVar5 == (QTLWExtra *)0x0 ||
      (pQVar5 = QWidgetPrivate::maybeTopData(in_RDI), (*(ushort *)&pQVar5->field_0xe0 >> 8 & 1) == 0
      )))) {
    QWidgetPrivate::frameStrut(in_stack_ffffffffffffffd8);
    QRect::topLeft(in_stack_ffffffffffffffb8);
    QPoint::operator-=((QPoint *)in_RDI,(QPoint *)in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

QPoint QWidget::pos() const
{
    Q_D(const QWidget);
    QPoint result = data->crect.topLeft();
    if (isWindow() && ! (windowType() == Qt::Popup))
        if (!d->maybeTopData() || !d->maybeTopData()->posIncludesFrame)
            result -= d->frameStrut().topLeft();
    return result;
}